

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O2

bool __thiscall Analyzer::onlyEmptyStatements(Analyzer *this,int from,Node *node)

{
  pointer ppNVar1;
  Node *pNVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)from;
  ppNVar1 = (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar4 = (long)(node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppNVar1 >> 3;
  while ((uVar3 < uVar4 &&
         ((pNVar2 = ppNVar1[uVar3], pNVar2 == (Node *)0x0 ||
          (pNVar2->nodeType == PNT_EMPTY_STATEMENT))))) {
    uVar3 = uVar3 + 1;
  }
  return uVar4 <= uVar3;
}

Assistant:

bool onlyEmptyStatements(int from, Node * node)
  {
    for (size_t i = from; i < node->children.size(); i++)
      if (node->children[i] && node->children[i]->nodeType != PNT_EMPTY_STATEMENT)
        return false;
    return true;
  }